

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Float pbrt::SampleCatmullRom
                (span<const_float> nodes,span<const_float> f,span<const_float> F,Float u,Float *fval
                ,Float *pdf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  ulong uVar15;
  long lVar16;
  float *pfVar17;
  ulong uVar18;
  float *pfVar19;
  float *pfVar20;
  int iVar21;
  ulong uVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 in_ZMM16 [64];
  undefined1 auVar36 [64];
  size_t vb;
  size_t va;
  undefined1 auVar27 [16];
  
  pfVar20 = F.ptr;
  vb = f.n;
  pfVar17 = f.ptr;
  va = nodes.n;
  pfVar19 = nodes.ptr;
  if (va != vb) {
    LogFatal<char_const(&)[13],char_const(&)[9],char_const(&)[13],unsigned_long&,char_const(&)[9],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.cpp"
               ,0x180,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])"nodes.size()",
               (char (*) [9])0x3f35b8,(char (*) [13])"nodes.size()",&va,(char (*) [9])0x3f35b8,&vb);
  }
  if (va != F.n) {
    vb = F.n;
    LogFatal<char_const(&)[9],char_const(&)[9],char_const(&)[9],unsigned_long&,char_const(&)[9],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.cpp"
               ,0x181,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])0x3f35b8,
               (char (*) [9])"F.size()",(char (*) [9])0x3f35b8,&va,(char (*) [9])"F.size()",&vb);
  }
  uVar15 = va - 2;
  if ((long)uVar15 < 1) {
    uVar18 = 0;
  }
  else {
    lVar16 = 1;
    uVar18 = uVar15;
    do {
      uVar22 = uVar18 >> 1;
      uVar18 = ~uVar22 + uVar18;
      lVar14 = uVar22 + 1 + lVar16;
      if (u * pfVar20[va - 1] < pfVar20[(int)uVar22 + (int)lVar16]) {
        uVar18 = uVar22;
        lVar14 = lVar16;
      }
      lVar16 = lVar14;
    } while (0 < (long)uVar18);
    if (lVar16 - 1U < uVar15) {
      uVar15 = lVar16 - 1U;
    }
    uVar18 = 0;
    if (0 < lVar16) {
      uVar18 = uVar15;
    }
  }
  iVar21 = (int)uVar18;
  fVar1 = pfVar19[iVar21];
  fVar23 = pfVar17[iVar21];
  lVar16 = (long)((uVar18 << 0x20) + 0x100000000) >> 0x1e;
  fVar32 = *(float *)((long)pfVar19 + lVar16);
  fVar2 = *(float *)((long)pfVar17 + lVar16);
  fVar3 = fVar32 - fVar1;
  if (iVar21 < 1) {
    fVar32 = fVar2 - fVar23;
  }
  else {
    fVar32 = (fVar3 * (fVar2 - pfVar17[iVar21 - 1U])) / (fVar32 - pfVar19[iVar21 - 1U]);
  }
  uVar15 = (long)((uVar18 << 0x20) + 0x200000000) >> 0x20;
  if (uVar15 < va) {
    auVar24._0_4_ = (fVar3 * (pfVar17[uVar15] - fVar23)) / (pfVar19[uVar15] - fVar1);
    auVar24._4_12_ = SUB6012((undefined1  [60])0x0,0);
  }
  else {
    auVar24 = ZEXT416((uint)(fVar2 - fVar23));
  }
  auVar13 = vfmsub231ss_fma(auVar24,ZEXT416((uint)fVar32),ZEXT416(0xc0000000));
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)fVar2),auVar13,ZEXT416(0x3eaaaaab));
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)(fVar2 - fVar23)),ZEXT416(0x40400000));
  auVar24 = ZEXT416((uint)(fVar32 + auVar24._0_4_));
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar23 - fVar2) * 0.5)),auVar24,ZEXT416(0x3e800000));
  auVar12 = vfmadd231ss_fma(auVar24,ZEXT416((uint)(fVar23 - fVar2)),ZEXT416(0x40000000));
  fVar2 = fVar32 * 0.5;
  fVar33 = (u * pfVar20[va - 1] - pfVar20[iVar21]) / fVar3;
  auVar27._0_12_ = ZEXT812(0);
  auVar27._12_4_ = 0;
  fVar4 = auVar26._0_4_ - fVar23;
  auVar24 = vfmadd213ss_fma(ZEXT816(0) << 0x40,auVar11,ZEXT416((uint)fVar4));
  auVar24 = vfmadd213ss_fma(auVar24,auVar27,ZEXT416((uint)fVar2));
  auVar26 = ZEXT416((uint)(auVar12._0_4_ + auVar13._0_4_ + fVar32 + fVar23));
  auVar31 = ZEXT416((uint)fVar23);
  auVar24 = vfmadd213ss_fma(auVar24,auVar27,auVar31);
  auVar24 = vfmadd213ss_fma(auVar24,auVar27,auVar27);
  fVar5 = auVar24._0_4_ - fVar33;
  auVar28._8_4_ = 0x7fffffff;
  auVar28._0_8_ = 0x7fffffff7fffffff;
  auVar28._12_4_ = 0x7fffffff;
  auVar24 = vandps_avx512vl(ZEXT416((uint)fVar5),auVar28);
  if (1e-06 <= auVar24._0_4_) {
    fVar23 = (fVar2 + auVar11._0_4_ + fVar4 + fVar23 + 0.0) - fVar33;
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    auVar24 = vandps_avx512vl(ZEXT416((uint)fVar23),auVar29);
    fVar34 = auVar24._0_4_;
    if (1e-06 <= fVar34) {
      auVar24 = ZEXT816(0) << 0x20;
      auVar36 = ZEXT464(0x3f800000);
      auVar25 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      uVar6 = vcmpps_avx512vl(ZEXT416((uint)fVar5),auVar24,1);
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      fVar23 = 0.0 - fVar5 / (fVar23 - fVar5);
      while( true ) {
        auVar26 = vaddss_avx512f(auVar36._0_16_,auVar25);
        uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar23),auVar36._0_16_,1);
        bVar8 = (bool)((byte)uVar7 & 1);
        fVar5 = auVar26._0_4_ * 0.5;
        uVar7 = vcmpss_avx512f(auVar25,ZEXT416((uint)fVar23),1);
        bVar9 = (bool)((byte)uVar7 & 1);
        fVar23 = (float)((uint)bVar9 * ((uint)bVar8 * (int)fVar23 + (uint)!bVar8 * (int)fVar5) +
                        (uint)!bVar9 * (int)fVar5);
        auVar27 = ZEXT416((uint)fVar23);
        auVar28 = vfmadd213ss_avx512f(auVar11,auVar27,ZEXT416((uint)fVar4));
        auVar26 = vfmadd213ss_fma(auVar12,auVar27,auVar13);
        auVar28 = vfmadd213ss_avx512f(auVar28,auVar27,ZEXT416((uint)fVar2));
        auVar26 = vfmadd213ss_fma(auVar26,auVar27,ZEXT416((uint)fVar32));
        auVar28 = vfmadd213ss_avx512f(auVar28,auVar27,auVar31);
        auVar26 = vfmadd213ss_fma(auVar26,auVar27,auVar31);
        auVar28 = vfmadd213ss_avx512f(auVar28,auVar27,auVar24);
        auVar28 = vsubss_avx512f(auVar28,ZEXT416((uint)fVar33));
        auVar29 = vandps_avx512vl(auVar28,auVar35);
        vucomiss_avx512f(auVar29);
        if (fVar34 < 1e-06) break;
        uVar7 = vcmpps_avx512vl(auVar28,auVar24,5);
        bVar10 = (byte)uVar6 ^ (byte)uVar7;
        auVar29 = ZEXT416((uint)(bVar10 & 1) * auVar36._0_4_ +
                          (uint)!(bool)(bVar10 & 1) * (int)fVar23);
        auVar25._0_4_ = (uint)(bVar10 & 1) * (int)fVar23 + (uint)!(bool)(bVar10 & 1) * auVar25._0_4_
        ;
        auVar30 = vsubss_avx512f(auVar29,auVar25);
        vucomiss_avx512f(auVar30);
        if (fVar34 < 1e-06) break;
        auVar26 = vdivss_avx512f(auVar28,auVar26);
        auVar36 = ZEXT1664(auVar29);
        fVar23 = fVar23 - auVar26._0_4_;
      }
    }
    else {
      auVar27 = SUB6416(ZEXT464(0x3f800000),0);
    }
  }
  if (fval != (Float *)0x0) {
    *fval = auVar26._0_4_;
  }
  if (pdf != (Float *)0x0) {
    *pdf = auVar26._0_4_ / pfVar20[va - 1];
  }
  auVar24 = vfmadd213ss_fma(auVar27,ZEXT416((uint)fVar3),ZEXT416((uint)fVar1));
  return auVar24._0_4_;
}

Assistant:

Float SampleCatmullRom(pstd::span<const Float> nodes, pstd::span<const Float> f,
                       pstd::span<const Float> F, Float u, Float *fval, Float *pdf) {
    CHECK_EQ(nodes.size(), f.size());
    CHECK_EQ(f.size(), F.size());
    // Map _u_ to a spline interval by inverting _F_
    u *= F.back();
    int i = FindInterval(F.size(), [&](int i) { return F[i] <= u; });

    // Look up $x_i$ and function values of spline segment _i_
    Float x0 = nodes[i], x1 = nodes[i + 1];
    Float f0 = f[i], f1 = f[i + 1];
    Float width = x1 - x0;

    // Approximate derivatives using finite differences
    Float d0 = (i > 0) ? width * (f1 - f[i - 1]) / (x1 - nodes[i - 1]) : (f1 - f0);
    Float d1 = (i + 2 < nodes.size()) ? width * (f[i + 2] - f0) / (nodes[i + 2] - x0)
                                      : (f1 - f0);

    // Re-scale _u_ for continous spline sampling step
    u = (u - F[i]) / width;

    // Invert definite integral over spline segment
    Float Fhat, fhat;
    auto eval = [&](Float t) -> std::pair<Float, Float> {
        Fhat = EvaluatePolynomial(t, 0, f0, 0.5f * d0,
                                  (1.f / 3.f) * (-2 * d0 - d1) + f1 - f0,
                                  0.25f * (d0 + d1) + 0.5f * (f0 - f1));
        fhat = EvaluatePolynomial(t, f0, d0, -2 * d0 - d1 + 3 * (f1 - f0),
                                  d0 + d1 + 2 * (f0 - f1));
        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);

    if (fval != nullptr)
        *fval = fhat;
    if (pdf != nullptr)
        *pdf = fhat / F.back();
    return x0 + width * t;
}